

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O1

void __thiscall CTB<RemSP>::FirstScan(CTB<RemSP> *this)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Mat1i *pMVar4;
  Mat1b *pMVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  long local_48;
  long local_40;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar5->field_0x8;
  uVar14 = (ulong)iVar2;
  if (0 < (long)uVar14) {
    uVar3 = *(uint *)&pMVar5->field_0xc;
    lVar7 = (long)(int)uVar3;
    local_40 = -1;
    local_48 = 1;
    uVar16 = 0;
    do {
      if (0 < (int)uVar3) {
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar17 = *(long *)&pMVar4->field_0x10;
        lVar6 = **(long **)&pMVar4->field_0x48;
        lVar20 = lVar6 * uVar16 + lVar17;
        lVar9 = *(long *)&pMVar5->field_0x10;
        lVar13 = **(long **)&pMVar5->field_0x48;
        uVar11 = uVar16 | 1;
        lVar22 = lVar6 * local_40 + lVar17;
        lVar23 = lVar13 * local_40 + lVar9;
        lVar17 = lVar6 * local_48 + lVar17;
        lVar12 = lVar13 * local_48 + lVar9;
        lVar9 = lVar13 * uVar16 + lVar9;
        uVar10 = 0xffffffff;
        lVar13 = -4;
        lVar18 = 0;
        iVar21 = -1;
        uVar19 = 1;
        do {
          switch(uVar10) {
          case 1:
            if (*(char *)(lVar9 + -1 + uVar19) != '\0') {
              if (uVar16 == 0) {
LAB_001abd0d:
                if ((uVar19 == 1 || uVar16 == 0) || (*(char *)(lVar23 + -2 + uVar19) == '\0')) {
                  RemSP::P_[RemSP::length_] = RemSP::length_;
                  uVar15 = RemSP::length_ + 1;
                  *(uint *)(lVar20 + -4 + uVar19 * 4) = RemSP::length_;
                  RemSP::length_ = uVar15;
                }
                else {
                  *(undefined4 *)(lVar20 + -4 + uVar19 * 4) =
                       *(undefined4 *)(lVar22 + -8 + uVar19 * 4);
                }
                iVar21 = 6;
              }
              else if (*(char *)(lVar23 + -1 + uVar19) == '\0') {
                if ((lVar7 <= (long)uVar19) || (*(char *)(lVar23 + uVar19) == '\0'))
                goto LAB_001abd0d;
                uVar15 = *(uint *)(lVar22 + uVar19 * 4);
                *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
                iVar21 = 5;
                if ((uVar19 != 1) && (*(char *)(lVar23 + -2 + uVar19) != '\0')) {
                  RemSP::Merge(uVar15,*(uint *)(lVar22 + -8 + uVar19 * 4));
                }
              }
              else {
                *(undefined4 *)(lVar20 + -4 + uVar19 * 4) =
                     *(undefined4 *)(lVar22 + -4 + uVar19 * 4);
                iVar21 = 4;
              }
              uVar10 = 2;
              goto LAB_001abd6e;
            }
            uVar10 = 1;
            if ((uVar11 < uVar14) && (*(char *)(lVar12 + -1 + uVar19) != '\0')) {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar15 = RemSP::length_ + 1;
              *(uint *)(lVar17 + -4 + uVar19 * 4) = RemSP::length_;
              RemSP::length_ = uVar15;
              uVar10 = 3;
            }
            break;
          case 2:
            if (*(char *)(lVar9 + -1 + uVar19) == '\0') goto LAB_001ab95d;
            uVar10 = 2;
LAB_001ab8c5:
            if (iVar21 == 6) {
LAB_001ab990:
              uVar15 = *(uint *)(lVar20 + -8 + uVar19 * 4);
              *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
              iVar21 = 6;
              if (uVar16 != 0) {
LAB_001ab9a9:
                iVar21 = 6;
                if (((long)uVar19 < lVar7) && (*(char *)(lVar23 + uVar19) != '\0'))
                goto LAB_001abb88;
              }
            }
            else if (iVar21 == 5) {
LAB_001ab943:
              *(undefined4 *)(lVar20 + -4 + uVar19 * 4) = *(undefined4 *)(lVar20 + -8 + uVar19 * 4);
              iVar21 = 5;
              uVar10 = 5;
            }
            else if (iVar21 == 4) {
              uVar15 = *(uint *)(lVar20 + -8 + uVar19 * 4);
              *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
              goto LAB_001ab8ee;
            }
LAB_001abd6e:
            if (uVar11 < uVar14) {
              cVar1 = *(char *)(lVar12 + -1 + uVar19);
joined_r0x001abab1:
              if (cVar1 != '\0') goto LAB_001abd80;
            }
            break;
          case 3:
          case 7:
          case 9:
            if (*(char *)(lVar9 + -1 + uVar19) == '\0') {
              uVar10 = 1;
              if ((uVar11 < uVar14) && (*(char *)(lVar12 + -1 + uVar19) != '\0')) {
                *(undefined4 *)(lVar17 + -4 + uVar19 * 4) =
                     *(undefined4 *)(lVar17 + -8 + uVar19 * 4);
                uVar10 = 9;
              }
            }
            else {
              if (uVar16 == 0) {
LAB_001aba34:
                uVar15 = *(uint *)(lVar17 + -8 + uVar19 * 4);
                *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
                iVar21 = 6;
                if ((uVar19 != 1 && uVar16 != 0) && (*(char *)(lVar23 + -2 + uVar19) != '\0')) {
LAB_001aba67:
                  puVar8 = (uint *)((lVar20 - lVar6) + (lVar18 + -1) * 4);
LAB_001aba70:
                  RemSP::Merge(uVar15,*puVar8);
                }
              }
              else {
                if (*(char *)(lVar23 + -1 + uVar19) != '\0') {
                  uVar15 = *(uint *)(lVar22 + -4 + uVar19 * 4);
                  *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
                  puVar8 = (uint *)(lVar17 + lVar13);
                  iVar21 = 4;
                  goto LAB_001aba70;
                }
                if ((lVar7 <= (long)uVar19) || (*(char *)(lVar23 + uVar19) == '\0'))
                goto LAB_001aba34;
                uVar15 = *(uint *)(lVar22 + uVar19 * 4);
                *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
                RemSP::Merge(uVar15,*(uint *)(lVar17 + -8 + uVar19 * 4));
                iVar21 = 5;
                if ((uVar19 != 1) && (*(char *)(lVar23 + -2 + uVar19) != '\0')) {
                  uVar15 = *(uint *)(lVar20 + -4 + uVar19 * 4);
                  goto LAB_001aba67;
                }
              }
              uVar10 = 8;
              if (uVar11 < uVar14) {
                cVar1 = *(char *)(lVar12 + -1 + uVar19);
                goto joined_r0x001abab1;
              }
            }
            break;
          case 4:
            if (*(char *)(lVar9 + -1 + uVar19) != '\0') {
              uVar10 = 4;
              if (iVar21 == 6) goto LAB_001ab990;
              if (iVar21 == 5) goto LAB_001ab943;
              if (iVar21 != 4) goto LAB_001abd6e;
              uVar15 = *(uint *)(lVar20 + -8 + uVar19 * 4);
              *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
LAB_001ab8ee:
              uVar10 = 4;
              iVar21 = 6;
              if (uVar16 != 0) {
                bVar24 = *(char *)(lVar23 + -1 + uVar19) == '\0';
                if (bVar24) goto LAB_001ab9a9;
                iVar21 = (uint)bVar24 * 2 + 4;
              }
              goto LAB_001abd6e;
            }
            goto LAB_001ab95d;
          case 5:
            if (*(char *)(lVar9 + -1 + uVar19) != '\0') {
              uVar15 = *(uint *)(lVar20 + -8 + uVar19 * 4);
              *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
              iVar21 = 6;
              if (uVar16 != 0) {
                bVar24 = *(char *)(lVar23 + -1 + uVar19) == '\0';
                if (bVar24) {
                  if (((long)uVar19 < lVar7) && (*(char *)(lVar23 + uVar19) != '\0')) {
                    RemSP::Merge(uVar15,*(uint *)(lVar22 + uVar19 * 4));
                    iVar21 = 5;
                  }
                }
                else {
                  iVar21 = (uint)bVar24 * 2 + 4;
                }
              }
              uVar10 = 4;
              goto LAB_001abd6e;
            }
            goto LAB_001ab95d;
          case 6:
            if (*(char *)(lVar9 + -1 + uVar19) != '\0') {
              if (iVar21 == 6) {
                uVar15 = *(uint *)(lVar20 + -8 + uVar19 * 4);
                *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
                uVar10 = 6;
                if (((uVar16 == 0) || (lVar7 <= (long)uVar19)) ||
                   (*(char *)(lVar23 + uVar19) == '\0')) {
                  iVar21 = 6;
                }
                else {
LAB_001abb88:
                  RemSP::Merge(uVar15,*(uint *)(lVar22 + uVar19 * 4));
                  iVar21 = 5;
                }
              }
              else {
                uVar10 = 6;
                if (iVar21 == 5) goto LAB_001ab943;
              }
              goto LAB_001abd6e;
            }
            goto LAB_001ab95d;
          case 8:
            if (*(char *)(lVar9 + -1 + uVar19) != '\0') {
              uVar10 = 8;
              goto LAB_001ab8c5;
            }
LAB_001ab95d:
            uVar10 = 1;
            if ((uVar11 < uVar14) && (*(char *)(lVar12 + -1 + uVar19) != '\0')) {
              *(undefined4 *)(lVar17 + -4 + uVar19 * 4) = *(undefined4 *)(lVar20 + -8 + uVar19 * 4);
LAB_001ab986:
              uVar10 = 7;
            }
            break;
          case 0xffffffff:
            if (*(char *)(lVar9 + -1 + uVar19) != '\0') {
              if (uVar16 == 0) {
LAB_001abbf0:
                RemSP::P_[RemSP::length_] = RemSP::length_;
                iVar21 = 6;
                uVar15 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
              }
              else if (*(char *)(lVar23 + -1 + uVar19) == '\0') {
                if ((lVar7 <= (long)uVar19) || (*(char *)(lVar23 + uVar19) == '\0'))
                goto LAB_001abbf0;
                iVar21 = 5;
                uVar15 = *(uint *)(lVar22 + uVar19 * 4);
              }
              else {
                iVar21 = 4;
                uVar15 = *(uint *)(lVar22 + -4 + uVar19 * 4);
              }
              *(uint *)(lVar20 + -4 + uVar19 * 4) = uVar15;
              uVar10 = 2;
              if ((uVar14 <= uVar11) || (*(char *)(lVar12 + -1 + uVar19) == '\0')) break;
LAB_001abd80:
              *(undefined4 *)(lVar17 + -4 + uVar19 * 4) = *(undefined4 *)(lVar20 + -4 + uVar19 * 4);
              break;
            }
            uVar10 = 1;
            if ((uVar14 <= uVar11) || (*(char *)(lVar12 + -1 + uVar19) == '\0')) break;
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar15 = RemSP::length_ + 1;
            *(uint *)(lVar17 + -4 + uVar19 * 4) = RemSP::length_;
            RemSP::length_ = uVar15;
            goto LAB_001ab986;
          }
          lVar18 = lVar18 + 1;
          lVar13 = lVar13 + 4;
          bVar24 = uVar19 != uVar3;
          uVar19 = uVar19 + 1;
        } while (bVar24);
      }
      uVar16 = uVar16 + 2;
      local_40 = local_40 + 2;
      local_48 = local_48 + 2;
    } while ((int)uVar16 < iVar2);
  }
  return;
}

Assistant:

void FirstScan() 
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5
    }